

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

size_t required_signature_size(signature2_t *sig,picnic_instance_t *params)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  long in_RSI;
  long in_RDI;
  uint16_t P_t;
  uint16_t t;
  size_t per_round;
  size_t bytesRequired;
  undefined2 local_22;
  undefined8 local_18;
  
  local_18 = *(long *)(in_RDI + 0x38) +
             *(long *)(in_RDI + 0x28) + (long)(int)(*(byte *)(in_RSI + 6) + 0x20);
  bVar1 = *(byte *)(in_RSI + 6);
  bVar2 = *(byte *)(in_RSI + 8);
  bVar3 = *(byte *)(in_RSI + 9);
  for (local_22 = 0; local_22 < *(ushort *)(in_RSI + 4); local_22 = local_22 + 1) {
    iVar5 = contains(*(uint16_t **)(in_RDI + 0x48),(ulong)*(byte *)(in_RSI + 10),local_22);
    if (iVar5 != 0) {
      lVar4 = *(long *)(in_RDI + 0x50);
      iVar5 = indexOf(*(uint16_t **)(in_RDI + 0x48),(ulong)*(byte *)(in_RSI + 10),local_22);
      local_18 = *(long *)(*(long *)(in_RDI + 0x58) + (ulong)local_22 * 0x38 + 8) + local_18;
      if ((uint)*(ushort *)(lVar4 + (long)iVar5 * 2) != *(byte *)(in_RSI + 0xb) - 1) {
        local_18 = *(byte *)(in_RSI + 9) + local_18;
      }
      local_18 = (long)(int)((uint)bVar1 + (uint)bVar2 + (uint)bVar3) + local_18;
    }
  }
  return local_18;
}

Assistant:

static size_t required_signature_size(const signature2_t* sig, const picnic_instance_t* params) {
  /* Compute the number of bytes required for the signature */
  size_t bytesRequired = params->digest_size + SALT_SIZE; /* challenge and salt */

  /* Encode only iSeedInfo, the length will be recomputed by deserialize */
  bytesRequired += sig->iSeedInfoLen;
  bytesRequired += sig->cvInfoLen;

  const size_t per_round = params->digest_size + params->input_output_size + params->view_size;
  for (uint16_t t = 0; t < params->num_rounds; t++) { /* proofs */
    if (contains(sig->challengeC, params->num_opened_rounds, t)) {
      uint16_t P_t = sig->challengeP[indexOf(sig->challengeC, params->num_opened_rounds, t)];
      bytesRequired += sig->proofs[t].seedInfoLen;
      if (P_t != (params->num_MPC_parties - 1u)) {
        bytesRequired += params->view_size;
      }
      bytesRequired += per_round;
    }
  }

  return bytesRequired;
}